

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitwise.cpp
# Opt level: O3

uhugeint_t
duckdb::BitwiseShiftLeftOperator::
Operation<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t>
          (uhugeint_t input,uhugeint_t shift)

{
  char cVar1;
  OutOfRangeException *pOVar2;
  uint64_t in_RDX;
  uint64_t in_RSI;
  uint64_t in_RDI;
  uhugeint_t uVar3;
  uhugeint_t uVar4;
  uhugeint_t uVar5;
  uhugeint_t uVar6;
  uhugeint_t uVar7;
  uhugeint_t uVar8;
  uhugeint_t max_shift;
  uhugeint_t max_value;
  string local_168;
  uhugeint_t local_148;
  uhugeint_t local_138;
  uhugeint_t local_128;
  uhugeint_t local_110;
  uhugeint_t local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  uhugeint_t local_50;
  uhugeint_t local_40;
  uhugeint_t local_30;
  
  local_148.lower = in_RDX;
  local_138.lower = in_RDI;
  local_138.upper = in_RSI;
  duckdb::uhugeint_t::uhugeint_t((uhugeint_t *)&local_168,0x80);
  duckdb::uhugeint_t::uhugeint_t(&local_100,1);
  local_110 = (uhugeint_t)duckdb::uhugeint_t::operator+((uhugeint_t *)&local_168,&local_100);
  duckdb::uhugeint_t::uhugeint_t((uhugeint_t *)&local_168,0);
  cVar1 = duckdb::uhugeint_t::operator<(&local_138,(uhugeint_t *)&local_168);
  if (cVar1 != '\0') {
    pOVar2 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_168,"Cannot left-shift negative number %s","");
    uVar4.upper = local_138.lower;
    uVar4.lower = (uint64_t)&local_70;
    duckdb::NumericHelper::ToString<duckdb::uhugeint_t>(uVar4);
    OutOfRangeException::OutOfRangeException<std::__cxx11::string>(pOVar2,&local_168,&local_70);
    __cxa_throw(pOVar2,&OutOfRangeException::typeinfo,std::runtime_error::~runtime_error);
  }
  duckdb::uhugeint_t::uhugeint_t((uhugeint_t *)&local_168,0);
  cVar1 = duckdb::uhugeint_t::operator<(&local_148,(uhugeint_t *)&local_168);
  if (cVar1 == '\0') {
    cVar1 = duckdb::uhugeint_t::operator>=(&local_148,&local_110);
    if (cVar1 == '\0') {
      duckdb::uhugeint_t::uhugeint_t((uhugeint_t *)&local_168,0);
      cVar1 = duckdb::uhugeint_t::operator==(&local_148,(uhugeint_t *)&local_168);
      if (cVar1 == '\0') {
        duckdb::uhugeint_t::uhugeint_t((uhugeint_t *)&local_168,1);
        local_40 = (uhugeint_t)duckdb::uhugeint_t::operator-(&local_110,&local_148);
        duckdb::uhugeint_t::uhugeint_t(&local_50,1);
        local_30 = (uhugeint_t)duckdb::uhugeint_t::operator-(&local_40,&local_50);
        local_100 = (uhugeint_t)duckdb::uhugeint_t::operator<<((uhugeint_t *)&local_168,&local_30);
        cVar1 = duckdb::uhugeint_t::operator>=(&local_138,&local_100);
        if (cVar1 != '\0') {
          pOVar2 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
          local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_168,"Overflow in left shift (%s << %s)","");
          uVar7.upper = local_138.lower;
          uVar7.lower = (uint64_t)&local_d0;
          duckdb::NumericHelper::ToString<duckdb::uhugeint_t>(uVar7);
          uVar8.upper = local_148.lower;
          uVar8.lower = (uint64_t)&local_f0;
          duckdb::NumericHelper::ToString<duckdb::uhugeint_t>(uVar8);
          OutOfRangeException::OutOfRangeException<std::__cxx11::string,std::__cxx11::string>
                    (pOVar2,&local_168,&local_d0,&local_f0);
          __cxa_throw(pOVar2,&OutOfRangeException::typeinfo,std::runtime_error::~runtime_error);
        }
        uVar3 = (uhugeint_t)duckdb::uhugeint_t::operator<<(&local_138,&local_148);
      }
      else {
        uVar3.upper = local_138.upper;
        uVar3.lower = local_138.lower;
      }
    }
    else {
      duckdb::uhugeint_t::uhugeint_t((uhugeint_t *)&local_168,0);
      cVar1 = duckdb::uhugeint_t::operator==(&local_138,(uhugeint_t *)&local_168);
      if (cVar1 == '\0') {
        pOVar2 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_168,"Left-shift value %s is out of range","");
        uVar6.upper = local_148.lower;
        uVar6.lower = (uint64_t)&local_b0;
        duckdb::NumericHelper::ToString<duckdb::uhugeint_t>(uVar6);
        OutOfRangeException::OutOfRangeException<std::__cxx11::string>(pOVar2,&local_168,&local_b0);
        __cxa_throw(pOVar2,&OutOfRangeException::typeinfo,std::runtime_error::~runtime_error);
      }
      duckdb::uhugeint_t::uhugeint_t(&local_128,0);
      uVar3.upper = local_128.upper;
      uVar3.lower = local_128.lower;
    }
    return uVar3;
  }
  pOVar2 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_168,"Cannot left-shift by negative number %s","");
  uVar5.upper = local_148.lower;
  uVar5.lower = (uint64_t)&local_90;
  duckdb::NumericHelper::ToString<duckdb::uhugeint_t>(uVar5);
  OutOfRangeException::OutOfRangeException<std::__cxx11::string>(pOVar2,&local_168,&local_90);
  __cxa_throw(pOVar2,&OutOfRangeException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA input, TB shift) {
		TA max_shift = TA(sizeof(TA) * 8) + (NumericLimits<TA>::IsSigned() ? 0 : 1);
		if (input < 0) {
			throw OutOfRangeException("Cannot left-shift negative number %s", NumericHelper::ToString(input));
		}
		if (shift < 0) {
			throw OutOfRangeException("Cannot left-shift by negative number %s", NumericHelper::ToString(shift));
		}
		if (shift >= max_shift) {
			if (input == 0) {
				return 0;
			}
			throw OutOfRangeException("Left-shift value %s is out of range", NumericHelper::ToString(shift));
		}
		if (shift == 0) {
			return input;
		}
		TA max_value = UnsafeNumericCast<TA>((TA(1) << (max_shift - shift - 1)));
		if (input >= max_value) {
			throw OutOfRangeException("Overflow in left shift (%s << %s)", NumericHelper::ToString(input),
			                          NumericHelper::ToString(shift));
		}
		return UnsafeNumericCast<TR>(input << shift);
	}